

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O3

Float __thiscall pbrt::BilinearPatch::PDF(BilinearPatch *this,ShapeSampleContext *ctx,Vector3f *wi)

{
  ulong *puVar1;
  Point3f *s;
  ulong *puVar2;
  undefined4 *puVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  long lVar8;
  float fVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  byte bVar18;
  bool bVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  undefined1 auVar28 [16];
  long in_FS_OFFSET;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar29 [16];
  undefined1 auVar38 [16];
  undefined1 auVar32 [32];
  undefined1 auVar34 [32];
  undefined1 auVar36 [32];
  Float FVar39;
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar46 [56];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  float fVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined4 uVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  Point3f PVar77;
  optional<pbrt::ShapeIntersection> isect;
  Ray ray;
  Tuple3<pbrt::Vector3,_float> local_208;
  Tuple3<pbrt::Vector3,_float> local_1f8;
  Tuple3<pbrt::Vector3,_float> local_1e8;
  Tuple3<pbrt::Vector3,_float> local_1d8;
  undefined1 local_1c8 [16];
  Tuple3<pbrt::Vector3,_float> local_1b8;
  Tuple3<pbrt::Vector3,_float> local_1a8;
  Tuple3<pbrt::Point3,_float> local_198;
  float local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  Tuple3<pbrt::Point3,_float> local_178;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_168;
  char local_68;
  Ray local_58;
  undefined1 auVar33 [32];
  undefined1 auVar35 [32];
  undefined1 auVar37 [32];
  undefined1 extraout_var [56];
  
  local_1c8._8_8_ = local_1c8._0_8_;
  auVar46 = in_ZMM0._8_56_;
  PVar77 = ShapeSampleContext::OffsetRayOrigin(ctx,wi);
  local_58.o.super_Tuple3<pbrt::Point3,_float>.z = PVar77.super_Tuple3<pbrt::Point3,_float>.z;
  auVar44._0_8_ = PVar77.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar44._8_56_ = auVar46;
  local_58.time = *(Float *)(ctx + 0x30);
  local_58.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar44._0_16_);
  local_58.d.super_Tuple3<pbrt::Vector3,_float>.z = (wi->super_Tuple3<pbrt::Vector3,_float>).z;
  local_58.d.super_Tuple3<pbrt::Vector3,_float>.x = (wi->super_Tuple3<pbrt::Vector3,_float>).x;
  local_58.d.super_Tuple3<pbrt::Vector3,_float>.y = (wi->super_Tuple3<pbrt::Vector3,_float>).y;
  local_58.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )0;
  Intersect((optional<pbrt::ShapeIntersection> *)&local_168.__align,this,&local_58,INFINITY);
  if ((PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::reg == '\0') &&
     (iVar20 = __cxa_guard_acquire(&PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)
                                    ::reg), iVar20 != 0)) {
    StatRegisterer::StatRegisterer
              ((StatRegisterer *)
               &PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::reg,
               PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::StatsAccumulator__,
               (PixelAccumFunc)0x0);
    __cxa_guard_release(&PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::reg);
  }
  *(long *)(in_FS_OFFSET + -0x448) = *(long *)(in_FS_OFFSET + -0x448) + 1;
  if (local_68 == '\0') {
    *(long *)(in_FS_OFFSET + -0x450) = *(long *)(in_FS_OFFSET + -0x450) + 1;
    local_188 = 0.0;
  }
  else {
    auVar28 = vinsertps_avx(*(undefined1 (*) [16])ctx,ZEXT416(*(uint *)(ctx + 0xc)),0x10);
    local_208.z = (*(float *)(ctx + 0x10) + *(float *)(ctx + 0x14)) * 0.5;
    auVar30._0_4_ = (float)*(undefined8 *)(ctx + 4) + auVar28._0_4_;
    auVar30._4_4_ = (float)((ulong)*(undefined8 *)(ctx + 4) >> 0x20) + auVar28._4_4_;
    auVar30._8_4_ = auVar28._8_4_ + 0.0;
    auVar30._12_4_ = auVar28._12_4_ + 0.0;
    auVar28._8_4_ = 0x3f000000;
    auVar28._0_8_ = 0x3f0000003f000000;
    auVar28._12_4_ = 0x3f000000;
    auVar27 = vmulps_avx512vl(auVar30,auVar28);
    lVar8 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
    lVar24 = *(long *)(lVar8 + 0x10);
    lVar25 = (long)this->blpIndex * 0x10;
    lVar8 = *(long *)(lVar8 + 0x18);
    lVar21 = (long)*(int *)(lVar24 + lVar25);
    lVar22 = (long)*(int *)(lVar24 + 4 + lVar25);
    auVar52._8_8_ = 0;
    auVar52._0_8_ = *(ulong *)(lVar8 + lVar21 * 0xc);
    local_1c8._0_8_ = lVar21 * 3;
    lVar23 = (long)*(int *)(lVar24 + 8 + lVar25);
    auVar30 = vsubps_avx(auVar52,auVar27);
    local_1d8.z = *(float *)(lVar8 + 8 + lVar21 * 0xc) - local_208.z;
    lVar24 = (long)*(int *)(lVar24 + 0xc + lVar25);
    auVar58._0_4_ = auVar30._0_4_ * auVar30._0_4_;
    auVar58._4_4_ = auVar30._4_4_ * auVar30._4_4_;
    auVar58._8_4_ = auVar30._8_4_ * auVar30._8_4_;
    auVar58._12_4_ = auVar30._12_4_ * auVar30._12_4_;
    auVar28 = vmovshdup_avx(auVar58);
    auVar28 = vfmadd231ss_fma(auVar28,auVar30,auVar30);
    auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)local_1d8.z),ZEXT416((uint)local_1d8.z));
    auVar28 = vsqrtss_avx(auVar28,auVar28);
    fVar40 = auVar28._0_4_;
    auVar65._4_4_ = fVar40;
    auVar65._0_4_ = fVar40;
    auVar65._8_4_ = fVar40;
    auVar65._12_4_ = fVar40;
    local_1d8.z = local_1d8.z / fVar40;
    auVar28 = vdivps_avx(auVar30,auVar65);
    local_1d8._0_8_ = vmovlps_avx(auVar28);
    auVar53._8_8_ = 0;
    auVar53._0_8_ = *(ulong *)(lVar8 + lVar22 * 0xc);
    auVar30 = vsubps_avx(auVar53,auVar27);
    local_1e8.z = *(float *)(lVar8 + 8 + lVar22 * 0xc) - local_208.z;
    auVar59._0_4_ = auVar30._0_4_ * auVar30._0_4_;
    auVar59._4_4_ = auVar30._4_4_ * auVar30._4_4_;
    auVar59._8_4_ = auVar30._8_4_ * auVar30._8_4_;
    auVar59._12_4_ = auVar30._12_4_ * auVar30._12_4_;
    auVar28 = vmovshdup_avx(auVar59);
    auVar28 = vfmadd231ss_fma(auVar28,auVar30,auVar30);
    auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)local_1e8.z),ZEXT416((uint)local_1e8.z));
    auVar28 = vsqrtss_avx(auVar28,auVar28);
    fVar40 = auVar28._0_4_;
    auVar66._4_4_ = fVar40;
    auVar66._0_4_ = fVar40;
    auVar66._8_4_ = fVar40;
    auVar66._12_4_ = fVar40;
    local_1e8.z = local_1e8.z / fVar40;
    auVar28 = vdivps_avx(auVar30,auVar66);
    local_1e8._0_8_ = vmovlps_avx(auVar28);
    auVar29._8_8_ = 0;
    auVar29._0_8_ = *(ulong *)(lVar8 + lVar23 * 0xc);
    auVar30 = vsubps_avx(auVar29,auVar27);
    local_1f8.z = *(float *)(lVar8 + 8 + lVar23 * 0xc) - local_208.z;
    auVar60._0_4_ = auVar30._0_4_ * auVar30._0_4_;
    auVar60._4_4_ = auVar30._4_4_ * auVar30._4_4_;
    auVar60._8_4_ = auVar30._8_4_ * auVar30._8_4_;
    auVar60._12_4_ = auVar30._12_4_ * auVar30._12_4_;
    auVar28 = vmovshdup_avx(auVar60);
    auVar28 = vfmadd231ss_fma(auVar28,auVar30,auVar30);
    auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)local_1f8.z),ZEXT416((uint)local_1f8.z));
    auVar28 = vsqrtss_avx(auVar28,auVar28);
    fVar40 = auVar28._0_4_;
    auVar67._4_4_ = fVar40;
    auVar67._0_4_ = fVar40;
    auVar67._8_4_ = fVar40;
    auVar67._12_4_ = fVar40;
    local_1f8.z = local_1f8.z / fVar40;
    auVar28 = vdivps_avx(auVar30,auVar67);
    local_1f8._0_8_ = vmovlps_avx(auVar28);
    local_208.z = *(float *)(lVar8 + 8 + lVar24 * 0xc) - local_208.z;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = *(ulong *)(lVar8 + lVar24 * 0xc);
    auVar30 = vsubps_avx(auVar50,auVar27);
    auVar27._0_4_ = auVar30._0_4_ * auVar30._0_4_;
    auVar27._4_4_ = auVar30._4_4_ * auVar30._4_4_;
    auVar27._8_4_ = auVar30._8_4_ * auVar30._8_4_;
    auVar27._12_4_ = auVar30._12_4_ * auVar30._12_4_;
    auVar28 = vmovshdup_avx(auVar27);
    auVar28 = vfmadd231ss_fma(auVar28,auVar30,auVar30);
    auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)local_208.z),ZEXT416((uint)local_208.z));
    auVar28 = vsqrtss_avx(auVar28,auVar28);
    fVar40 = auVar28._0_4_;
    auVar38._4_4_ = fVar40;
    auVar38._0_4_ = fVar40;
    auVar38._8_4_ = fVar40;
    auVar38._12_4_ = fVar40;
    local_208.z = local_208.z / fVar40;
    auVar28 = vdivps_avx(auVar30,auVar38);
    local_208._0_8_ = vmovlps_avx(auVar28);
    bVar19 = IsRectangle(this);
    if (((!bVar19) ||
        (*(long *)(*(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8) + 0x38) != 0)) ||
       (FVar39 = SphericalQuadArea((Vector3f *)&local_1d8,(Vector3f *)&local_1e8,
                                   (Vector3f *)&local_208,(Vector3f *)&local_1f8), FVar39 <= 0.0001)
       ) {
      if ((local_68 != '\x01') ||
         (FVar39 = PDF(this,(Interaction *)&local_168.__align), local_68 == '\0')) {
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x2f54c6d);
      }
      auVar15._8_4_ = 0x80000000;
      auVar15._0_8_ = 0x8000000080000000;
      auVar15._12_4_ = 0x80000000;
      auVar30 = ZEXT416((uint)(wi->super_Tuple3<pbrt::Vector3,_float>).z);
      auVar28 = vxorps_avx512vl(auVar30,auVar15);
      auVar27 = ZEXT416((uint)((float)local_168._48_4_ * auVar28._0_4_));
      auVar28 = vfnmadd132ss_fma(ZEXT416((uint)local_168._44_4_),auVar27,
                                 ZEXT416((uint)(wi->super_Tuple3<pbrt::Vector3,_float>).y));
      auVar30 = vfnmsub213ss_fma(auVar30,ZEXT416((uint)local_168._48_4_),auVar27);
      auVar28 = vfnmadd231ss_fma(ZEXT416((uint)(auVar28._0_4_ + auVar30._0_4_)),
                                 ZEXT416((uint)local_168._40_4_),
                                 ZEXT416((uint)(wi->super_Tuple3<pbrt::Vector3,_float>).x));
      auVar16._8_4_ = 0x7fffffff;
      auVar16._0_8_ = 0x7fffffff7fffffff;
      auVar16._12_4_ = 0x7fffffff;
      auVar30 = vandps_avx512vl(auVar28,auVar16);
      fVar40 = (*(float *)(ctx + 8) + *(float *)(ctx + 0xc)) * 0.5 -
               ((float)local_168._8_4_ + (float)local_168._12_4_) * 0.5;
      auVar28 = ZEXT416((uint)((*(float *)ctx + *(float *)(ctx + 4)) * 0.5 -
                              ((float)local_168._0_4_ + (float)local_168._4_4_) * 0.5));
      auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar40 * fVar40)),auVar28,auVar28);
      auVar27 = ZEXT416((uint)((*(float *)(ctx + 0x10) + *(float *)(ctx + 0x14)) * 0.5 -
                              ((float)local_168._16_4_ + (float)local_168._20_4_) * 0.5));
      auVar28 = vfmadd231ss_fma(auVar28,auVar27,auVar27);
      local_188 = FVar39 / (auVar30._0_4_ / auVar28._0_4_);
      local_188 = (float)((uint)(ABS(local_188) != INFINITY) * (int)local_188);
    }
    else {
      FVar39 = SphericalQuadArea((Vector3f *)&local_1d8,(Vector3f *)&local_1e8,
                                 (Vector3f *)&local_208,(Vector3f *)&local_1f8);
      fVar40 = *(float *)(ctx + 0x24);
      fVar57 = *(float *)(ctx + 0x2c);
      local_188 = 1.0 / FVar39;
      fVar47 = *(float *)(ctx + 0x28);
      if (((fVar40 != 0.0) || (fVar47 != 0.0)) || ((fVar57 != 0.0 || (NAN(fVar57))))) {
        puVar1 = (ulong *)(lVar8 + lVar23 * 0xc);
        uStack_184 = 0;
        uStack_180 = 0;
        uStack_17c = 0;
        auVar51._4_4_ = fVar57;
        auVar51._0_4_ = fVar57;
        auVar51._8_4_ = fVar57;
        auVar51._12_4_ = fVar57;
        auVar48._4_4_ = fVar47;
        auVar48._0_4_ = fVar47;
        auVar48._8_4_ = fVar47;
        auVar48._12_4_ = fVar47;
        s = (Point3f *)(lVar8 + local_1c8._0_8_ * 4);
        puVar2 = (ulong *)(lVar8 + lVar22 * 0xc);
        puVar3 = (undefined4 *)(lVar8 + lVar24 * 0xc);
        auVar54._8_8_ = 0;
        auVar54._0_8_ = s;
        auVar61._8_8_ = 0;
        auVar61._0_8_ = puVar2;
        auVar28 = vpunpcklqdq_avx(auVar61,auVar54);
        auVar62._8_8_ = 0;
        auVar62._0_8_ = puVar1;
        auVar68._8_8_ = 0;
        auVar68._0_8_ = puVar3;
        auVar30 = vpunpcklqdq_avx(auVar68,auVar62);
        auVar56._0_16_ = ZEXT116(0) * auVar28 + ZEXT116(1) * auVar30;
        auVar56._16_16_ = ZEXT116(1) * auVar28;
        auVar31._8_4_ = 8;
        auVar31._0_8_ = 8;
        auVar31._12_4_ = 0;
        auVar31._16_8_ = 8;
        auVar31._24_8_ = 8;
        auVar31 = vpaddq_avx512vl(auVar56,auVar31);
        auVar28 = vinsertps_avx(*(undefined1 (*) [16])ctx,ZEXT416(*(uint *)(ctx + 0xc)),0x10);
        auVar55._0_4_ = (float)*(undefined8 *)(ctx + 4) + auVar28._0_4_;
        auVar55._4_4_ = (float)((ulong)*(undefined8 *)(ctx + 4) >> 0x20) + auVar28._4_4_;
        auVar55._8_4_ = auVar28._8_4_ + 0.0;
        auVar55._12_4_ = auVar28._12_4_ + 0.0;
        auVar11._8_4_ = 0x3f000000;
        auVar11._0_8_ = 0x3f0000003f000000;
        auVar11._12_4_ = 0x3f000000;
        auVar38 = auVar31._16_16_;
        auVar28 = vmulps_avx512vl(auVar55,auVar11);
        local_198.z = (*(float *)(ctx + 0x10) + *(float *)(ctx + 0x14)) * 0.5;
        local_198._0_8_ = vmovlps_avx(auVar28);
        uVar64 = auVar28._0_4_;
        auVar76._4_4_ = uVar64;
        auVar76._0_4_ = uVar64;
        auVar76._8_4_ = uVar64;
        auVar76._12_4_ = uVar64;
        auVar27 = vshufps_avx(auVar28,auVar28,0x55);
        uVar4 = (s->super_Tuple3<pbrt::Point3,_float>).x;
        uVar6 = (s->super_Tuple3<pbrt::Point3,_float>).y;
        auVar70._4_4_ = uVar6;
        auVar70._0_4_ = uVar4;
        auVar70._8_8_ = 0;
        auVar73._8_8_ = 0;
        auVar73._0_8_ = *puVar2;
        auVar75._8_8_ = 0;
        auVar75._0_8_ = *puVar1;
        auVar29 = vgatherqps_avx512vl(_DAT_00000000);
        auVar63._4_4_ = local_198.z;
        auVar63._0_4_ = local_198.z;
        auVar63._8_4_ = local_198.z;
        auVar63._12_4_ = local_198.z;
        auVar50 = vsubps_avx(auVar29,auVar63);
        auVar30 = vshufps_avx(auVar75,auVar73,0);
        auVar52 = vsubps_avx(auVar73,auVar70);
        auVar28 = vinsertps_avx(auVar75,auVar73,0x69);
        auVar69._4_12_ = auVar30._4_12_;
        auVar69._0_4_ = *puVar3;
        auVar74._4_12_ = auVar28._4_12_;
        auVar74._0_4_ = puVar3[1];
        auVar41._4_4_ = fVar40;
        auVar41._0_4_ = fVar40;
        auVar41._8_4_ = fVar40;
        auVar41._12_4_ = fVar40;
        auVar28 = vinsertps_avx(auVar69,auVar70,0x30);
        auVar30 = vinsertps_avx(auVar74,auVar70,0x70);
        auVar30 = vsubps_avx(auVar30,auVar27);
        auVar53 = vsubps_avx(auVar28,auVar76);
        local_1a8._0_8_ = vmovlps_avx(auVar52);
        auVar71._0_4_ = auVar30._0_4_ * auVar30._0_4_;
        auVar71._4_4_ = auVar30._4_4_ * auVar30._4_4_;
        auVar71._8_4_ = auVar30._8_4_ * auVar30._8_4_;
        auVar71._12_4_ = auVar30._12_4_ * auVar30._12_4_;
        auVar28 = vfmadd231ps_fma(auVar71,auVar53,auVar53);
        auVar28 = vfmadd231ps_fma(auVar28,auVar50,auVar50);
        auVar27 = vsqrtps_avx(auVar28);
        auVar28 = vdivps_avx(auVar50,auVar27);
        auVar30 = vdivps_avx(auVar30,auVar27);
        auVar27 = vdivps_avx(auVar53,auVar27);
        auVar72._0_4_ = fVar57 * auVar28._0_4_;
        auVar72._4_4_ = fVar57 * auVar28._4_4_;
        auVar72._8_4_ = fVar57 * auVar28._8_4_;
        auVar72._12_4_ = fVar57 * auVar28._12_4_;
        auVar50 = vfmsub213ps_fma(auVar28,auVar51,auVar72);
        auVar28 = vfmadd213ps_fma(auVar48,auVar30,auVar72);
        auVar30 = vmovshdup_avx(auVar29);
        auVar49._0_4_ = auVar28._0_4_ + auVar50._0_4_;
        auVar49._4_4_ = auVar28._4_4_ + auVar50._4_4_;
        auVar49._8_4_ = auVar28._8_4_ + auVar50._8_4_;
        auVar49._12_4_ = auVar28._12_4_ + auVar50._12_4_;
        auVar28 = vfmadd213ps_fma(auVar41,auVar27,auVar49);
        auVar12._8_4_ = 0x7fffffff;
        auVar12._0_8_ = 0x7fffffff7fffffff;
        auVar12._12_4_ = 0x7fffffff;
        local_1c8 = vandps_avx512vl(auVar28,auVar12);
        auVar28 = vhsubps_avx(auVar29,auVar29);
        auVar13._8_4_ = 0x3c23d70a;
        auVar13._0_8_ = 0x3c23d70a3c23d70a;
        auVar13._12_4_ = 0x3c23d70a;
        uVar10 = vcmpps_avx512vl(local_1c8,auVar13,0xe);
        bVar18 = (byte)uVar10;
        local_1a8.z = (float)vextractps_avx(auVar28,1);
        uVar5 = (s->super_Tuple3<pbrt::Point3,_float>).x;
        uVar7 = (s->super_Tuple3<pbrt::Point3,_float>).y;
        auVar42._4_4_ = uVar7;
        auVar42._0_4_ = uVar5;
        auVar42._8_8_ = 0;
        auVar28 = vshufps_avx(auVar29,auVar29,0xff);
        local_1b8.z = auVar30._0_4_ - auVar28._0_4_;
        auVar28 = vsubps_avx(auVar75,auVar42);
        local_1b8._0_8_ = vmovlps_avx(auVar28);
        if (local_68 == '\0') {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x2f54c6d);
        }
        auVar17._4_4_ = local_168._4_4_;
        auVar17._0_4_ = local_168._0_4_;
        auVar17._8_4_ = local_168._8_4_;
        auVar17._12_4_ = local_168._12_4_;
        auVar28 = vinsertps_avx(auVar17,ZEXT416((uint)local_168._12_4_),0x10);
        auVar43._0_4_ = (float)local_168._4_4_ + auVar28._0_4_;
        auVar43._4_4_ = (float)local_168._8_4_ + auVar28._4_4_;
        auVar43._8_4_ = auVar28._8_4_ + 0.0;
        auVar43._12_4_ = auVar28._12_4_ + 0.0;
        auVar14._8_4_ = 0x3f000000;
        auVar14._0_8_ = 0x3f0000003f000000;
        auVar14._12_4_ = 0x3f000000;
        auVar28 = vmulps_avx512vl(auVar43,auVar14);
        local_178.z = ((float)local_168._16_4_ + (float)local_168._20_4_) * 0.5;
        local_178._0_8_ = vmovlps_avx(auVar28);
        auVar45._0_8_ =
             InvertSphericalRectangleSample
                       ((Point3f *)&local_198,s,(Vector3f *)&local_1a8,(Vector3f *)&local_1b8,
                        (Point3f *)&local_178);
        auVar45._8_56_ = extraout_var;
        fVar57 = 0.0;
        fVar40 = auVar45._0_4_;
        if ((0.0 <= fVar40) && (fVar40 <= 1.0)) {
          auVar28 = vmovshdup_avx(auVar45._0_16_);
          fVar47 = auVar28._0_4_;
          if ((0.0 <= fVar47) && (fVar47 <= 1.0)) {
            auVar28 = vshufps_avx(local_1c8,local_1c8,0xff);
            auVar30 = SUB6416(ZEXT464(0x3c23d70a),0);
            auVar33._16_16_ = auVar38;
            auVar33._0_16_ = auVar30;
            auVar32._4_28_ = auVar33._4_28_;
            auVar32._0_4_ =
                 (float)((uint)(bVar18 & 1) * local_1c8._0_4_ +
                        (uint)!(bool)(bVar18 & 1) * 0x3c23d70a);
            auVar35._16_16_ = auVar38;
            auVar35._0_16_ = auVar30;
            auVar34._4_28_ = auVar35._4_28_;
            auVar34._0_4_ =
                 (float)((uint)(bVar18 >> 3 & 1) * auVar28._0_4_ +
                        (uint)!(bool)(bVar18 >> 3 & 1) * 0x3c23d70a);
            auVar28 = vshufps_avx(local_1c8,local_1c8,0x4e);
            fVar26 = (float)((uint)(bVar18 >> 2 & 1) * auVar28._0_4_ +
                            (uint)!(bool)(bVar18 >> 2 & 1) * 0x3c23d70a);
            auVar28 = vshufps_avx(local_1c8,local_1c8,0xf5);
            auVar37._16_16_ = auVar38;
            auVar37._0_16_ = auVar30;
            auVar36._4_28_ = auVar37._4_28_;
            auVar36._0_4_ =
                 (float)((uint)(bVar18 >> 1 & 1) * auVar28._0_4_ +
                        (uint)!(bool)(bVar18 >> 1 & 1) * 0x3c23d70a);
            fVar9 = auVar34._0_4_ + fVar26 + auVar36._0_4_ + auVar32._0_4_;
            fVar57 = 1.0;
            if ((fVar9 != 0.0) || (NAN(fVar9))) {
              auVar28 = vfmadd213ss_fma(auVar34._0_16_,
                                        ZEXT416((uint)((1.0 - fVar40) * (1.0 - fVar47))),
                                        ZEXT416((uint)(fVar40 * (1.0 - fVar47) * fVar26)));
              auVar28 = vfmadd213ss_fma(auVar36._0_16_,ZEXT416((uint)((1.0 - fVar40) * fVar47)),
                                        auVar28);
              auVar28 = vfmadd213ss_fma(auVar32._0_16_,ZEXT416((uint)(fVar40 * fVar47)),auVar28);
              fVar57 = (auVar28._0_4_ * 4.0) / fVar9;
            }
          }
        }
        local_188 = local_188 * fVar57;
      }
    }
  }
  return local_188;
}

Assistant:

Float BilinearPatch::PDF(const ShapeSampleContext &ctx, const Vector3f &wi) const {
    // Intersect sample ray with shape geometry
    Ray ray = ctx.SpawnRay(wi);
    pstd::optional<ShapeIntersection> isect = Intersect(ray);
    CHECK_RARE(1e-6, !isect.has_value());
    if (!isect)
        return 0;

    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const BilinearPatchMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];

    // Find normalized vectors to corners of bilinear patch
    Vector3f v00 = Normalize(p00 - ctx.p()), v10 = Normalize(p10 - ctx.p());
    Vector3f v01 = Normalize(p01 - ctx.p()), v11 = Normalize(p11 - ctx.p());

    if (IsRectangle() && !GetMesh()->imageDistribution &&
        SphericalQuadArea(v00, v10, v11, v01) > MinSphericalSampleArea) {
        // Return PDF for sample in spherical rectangle
        Float pdf = 1 / SphericalQuadArea(v00, v10, v11, v01);
        if (ctx.ns != Normal3f(0, 0, 0)) {
            // Compute $\cos \theta$ weights for rectangle seen from _ctx.p()_
            Point3f rp = ctx.p();
            pstd::array<Float, 4> w = pstd::array<Float, 4>{
                std::max<Float>(0.01, AbsDot(Normalize(p00 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p10 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p01 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p11 - rp), ctx.ns))};

            Point2f u = InvertSphericalRectangleSample(rp, p00, p10 - p00, p01 - p00,
                                                       isect->intr.p());
            return BilinearPDF(u, w) * pdf;
        } else
            return pdf;

    } else {
        // Return solid angle PDF for sampling bilinear patch at _intr_
        Float pdf = PDF(isect->intr) / (AbsDot(isect->intr.n, -wi) /
                                        DistanceSquared(ctx.p(), isect->intr.p()));
        if (IsInf(pdf))
            pdf = 0;
        return pdf;
    }
}